

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * google::protobuf::compiler::js::anon_unknown_0::GetJSFilename
                   (string *__return_storage_ptr__,GeneratorOptions *options,string *filename)

{
  string local_50;
  string local_30;
  
  StripProto(&local_30,filename);
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_50,options);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string GetJSFilename(const GeneratorOptions& options, const string& filename) {
  return StripProto(filename) + options.GetFileNameExtension();
}